

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_delta_decoder.h
# Opt level: O3

bool __thiscall
draco::PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::
ComputeOriginalValues
          (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
           *this,CorrType *in_corr,int *out_data,int size,int num_components,PointIndex *param_5)

{
  uint uVar1;
  pointer piVar2;
  void *__s;
  long lVar3;
  int *piVar4;
  int iVar5;
  CorrType *pCVar6;
  int iVar7;
  size_type sVar8;
  vector<int,_std::allocator<int>_> *this_00;
  ulong uVar9;
  size_type __new_size;
  
  (this->super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
  ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_ = num_components;
  this_00 = &(this->
             super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
             ).transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_;
  __new_size = (size_type)num_components;
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  uVar9 = 0xffffffffffffffff;
  if (-1 < num_components) {
    uVar9 = __new_size * 4;
  }
  __s = operator_new__(uVar9);
  memset(__s,0,uVar9);
  uVar1 = (this->
          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
          ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_;
  uVar9 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    piVar2 = (this->
             super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
             ).transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      iVar5 = *(int *)((long)__s + lVar3 * 4);
      iVar7 = (this->
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
      if ((iVar7 < iVar5) ||
         (iVar7 = (this->
                  super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                  ).transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_,
         iVar5 < iVar7)) {
        piVar2[lVar3] = iVar7;
      }
      else {
        piVar2[lVar3] = iVar5;
      }
      lVar3 = lVar3 + 1;
      iVar5 = (this->
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_;
      uVar9 = (ulong)iVar5;
    } while (lVar3 < (long)uVar9);
    if (0 < iVar5) {
      lVar3 = 0;
      do {
        iVar5 = in_corr[lVar3] + piVar2[lVar3];
        out_data[lVar3] = iVar5;
        if ((this->
            super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
            ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ < iVar5) {
          iVar7 = -(this->
                   super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                   ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
LAB_00150003:
          out_data[lVar3] = iVar5 + iVar7;
        }
        else if (iVar5 < (this->
                         super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                         ).transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_) {
          iVar7 = (this->
                  super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                  ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
          goto LAB_00150003;
        }
        lVar3 = lVar3 + 1;
        uVar9 = (ulong)(this->
                       super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                       ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_;
      } while (lVar3 < (long)uVar9);
    }
  }
  if (num_components < size) {
    piVar4 = out_data + __new_size;
    pCVar6 = in_corr + __new_size;
    sVar8 = __new_size;
    do {
      if (0 < (int)uVar9) {
        piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = 0;
        do {
          iVar5 = out_data[lVar3];
          iVar7 = (this->
                  super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                  ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
          if ((iVar7 < iVar5) ||
             (iVar7 = (this->
                      super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                      ).transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_,
             iVar5 < iVar7)) {
            piVar2[lVar3] = iVar7;
          }
          else {
            piVar2[lVar3] = iVar5;
          }
          lVar3 = lVar3 + 1;
          iVar5 = (this->
                  super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                  ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_;
          uVar9 = (ulong)iVar5;
        } while (lVar3 < (long)uVar9);
        if (0 < iVar5) {
          lVar3 = 0;
          do {
            iVar5 = pCVar6[lVar3] + piVar2[lVar3];
            piVar4[lVar3] = iVar5;
            if ((this->
                super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ < iVar5) {
              iVar7 = -(this->
                       super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                       ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
LAB_0015009c:
              piVar4[lVar3] = iVar5 + iVar7;
            }
            else if (iVar5 < (this->
                             super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                             ).transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_) {
              iVar7 = (this->
                      super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                      ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
              goto LAB_0015009c;
            }
            lVar3 = lVar3 + 1;
            uVar9 = (ulong)(this->
                           super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                           ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_
            ;
          } while (lVar3 < (long)uVar9);
        }
      }
      sVar8 = sVar8 + __new_size;
      out_data = out_data + __new_size;
      piVar4 = piVar4 + __new_size;
      pCVar6 = pCVar6 + __new_size;
    } while ((long)sVar8 < (long)size);
  }
  operator_delete__(__s);
  return true;
}

Assistant:

bool PredictionSchemeDeltaDecoder<DataTypeT, TransformT>::ComputeOriginalValues(
    const CorrType *in_corr, DataTypeT *out_data, int size, int num_components,
    const PointIndex *) {
  this->transform().Init(num_components);
  // Decode the original value for the first element.
  std::unique_ptr<DataTypeT[]> zero_vals(new DataTypeT[num_components]());
  this->transform().ComputeOriginalValue(zero_vals.get(), in_corr, out_data);

  // Decode data from the front using D(i) = D(i) + D(i - 1).
  for (int i = num_components; i < size; i += num_components) {
    this->transform().ComputeOriginalValue(out_data + i - num_components,
                                           in_corr + i, out_data + i);
  }
  return true;
}